

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

tensor * __thiscall square::forward(square *this,vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  undefined4 uVar1;
  undefined4 uVar2;
  tensor *ptVar3;
  tensor *ptVar4;
  
  (this->super_node).isbuild = true;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_node).grad_fn,
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  ptVar4 = (tensor *)operator_new(0x20);
  ptVar4->data = 0.0;
  ptVar4->grad = 0.0;
  ptVar4->cnt = 0;
  ptVar4->cnt_free = 0;
  ptVar4->hook = (node *)0x0;
  tensor::tensor_cnt = tensor::tensor_cnt + 1;
  (this->super_node).ret = ptVar4;
  ptVar3 = *(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ptVar4->data = ptVar3->data * ptVar3->data;
  *(this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = ptVar3->data + ptVar3->data;
  uVar1 = ptVar3->cnt;
  uVar2 = ptVar3->cnt_free;
  ptVar3->cnt = uVar1 + 1;
  ptVar3->cnt_free = uVar2 + 1;
  ptVar4->hook = &this->super_node;
  return ptVar4;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = input[0]->data*input[0]->data;
        grad_fn[0]=2*input[0]->data;
        input[0]->cnt++;
        input[0]->cnt_free++;
        ret->hook=this;
        return ret;
    }